

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O2

TWords * __thiscall
NJamSpell::TSpellCorrector::GetCandidatesRaw
          (TWords *__return_storage_ptr__,TSpellCorrector *this,TWords *sentence,size_t position)

{
  pointer pTVar1;
  pointer pTVar2;
  TWord origWord;
  TSpellCorrector *pTVar3;
  size_t sVar4;
  pointer pTVar5;
  pointer pTVar6;
  undefined8 *puVar7;
  ulong uVar8;
  pointer pTVar9;
  TWord *word;
  value_type *__x;
  long lVar10;
  size_t i;
  __node_base_ptr p_Var11;
  pointer pTVar12;
  __normal_iterator<NJamSpell::TScoredWord_*,_std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>_>
  __i;
  long lVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auStack_118 [8];
  TWord cand;
  undefined1 local_100 [8];
  unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
  uniqueCandidates;
  value_type local_a8;
  TSpellCorrector *local_90;
  undefined1 auStack_88 [8];
  TWords candSentence;
  undefined1 auStack_68 [8];
  TWord w;
  vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> scoredCandidates;
  
  pTVar1 = (sentence->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (position <
      (ulong)((long)(sentence->
                    super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl
                    .super__Vector_impl_data._M_finish - (long)pTVar1 >> 4)) {
    pTVar1 = pTVar1 + position;
    auStack_68 = (undefined1  [8])pTVar1->Ptr;
    w.Ptr = (wchar_t *)pTVar1->Len;
    word = (TWord *)auStack_68;
    Edits2(__return_storage_ptr__,this,word,true);
    pTVar1 = (__return_storage_ptr__->
             super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pTVar2 = (__return_storage_ptr__->
             super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pTVar6 = pTVar2;
    pTVar9 = pTVar1;
    local_90 = this;
    if (pTVar1 == pTVar2) {
      Edits((TWords *)local_100,this,(TWord *)auStack_68);
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::_M_move_assign
                (__return_storage_ptr__,
                 (_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_100);
      std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
                ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_100);
      pTVar9 = (__return_storage_ptr__->
               super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pTVar6 = (__return_storage_ptr__->
               super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    pTVar3 = local_90;
    if (pTVar9 != pTVar6) {
      local_100 = (undefined1  [8])&uniqueCandidates._M_h._M_bucket_count;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)local_100,auStack_68,(wchar_t *)((long)auStack_68 + w.Ptr * 4));
      join_0x00000010_0x00000000_ = TLangModel::GetWord(&pTVar3->LangModel,(wstring *)local_100);
      std::__cxx11::wstring::~wstring((wstring *)local_100);
      bVar14 = w.Len != 0;
      bVar15 = scoredCandidates.
               super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0;
      if (bVar15 && bVar14) {
        word = (TWord *)&w.Len;
        auStack_68 = (undefined1  [8])w.Len;
        w.Ptr = (wchar_t *)
                scoredCandidates.
                super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
                _M_impl.super__Vector_impl_data._M_start;
      }
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                (__return_storage_ptr__,word);
      std::
      _Hashtable<NJamSpell::TWord,NJamSpell::TWord,std::allocator<NJamSpell::TWord>,std::__detail::_Identity,std::equal_to<NJamSpell::TWord>,NJamSpell::TWordHashPtr,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _Hashtable<__gnu_cxx::__normal_iterator<NJamSpell::TWord*,std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>>
                ((_Hashtable<NJamSpell::TWord,NJamSpell::TWord,std::allocator<NJamSpell::TWord>,std::__detail::_Identity,std::equal_to<NJamSpell::TWord>,NJamSpell::TWordHashPtr,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_100,
                 (__return_storage_ptr__->
                 super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (__return_storage_ptr__->
                 super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
                 super__Vector_impl_data._M_finish,0,&w.Len,auStack_88,&local_a8);
      origWord.Len = (size_t)w.Ptr;
      origWord.Ptr = (wchar_t *)auStack_68;
      FilterCandidatesByFrequency
                (pTVar3,(unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                         *)local_100,origWord);
      stack0xffffffffffffffa8 = (TWord)ZEXT816(0);
      std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::reserve
                ((vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *)&w.Len,
                 (size_type)uniqueCandidates._M_h._M_before_begin._M_nxt);
      uniqueCandidates._M_h._M_single_bucket = (__node_base_ptr)(position + 2);
      for (puVar7 = (undefined8 *)uniqueCandidates._M_h._M_bucket_count; puVar7 != (undefined8 *)0x0
          ; puVar7 = (undefined8 *)*puVar7) {
        auStack_118 = (undefined1  [8])puVar7[1];
        cand.Ptr = (wchar_t *)puVar7[2];
        candSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        auStack_88 = (undefined1  [8])0x0;
        candSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        lVar10 = 0;
        for (p_Var11 = (__node_base_ptr)0x0; pTVar3 = local_90,
            pTVar9 = (sentence->
                     super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            p_Var11 < (__node_base_ptr)
                      ((long)(sentence->
                             super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar9 >> 4);
            p_Var11 = (__node_base_ptr)((long)&p_Var11->_M_nxt + 1)) {
          __x = (value_type *)auStack_118;
          if ((__node_base_ptr)position == p_Var11) {
LAB_0011c564:
            std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                      ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)auStack_88,__x
                      );
          }
          else if ((p_Var11 < position && position <= (undefined1 *)((long)&p_Var11->_M_nxt + 2U))
                  || (p_Var11 <= uniqueCandidates._M_h._M_single_bucket && position < p_Var11)) {
            __x = (value_type *)((long)&pTVar9->Ptr + lVar10);
            goto LAB_0011c564;
          }
          lVar10 = lVar10 + 0x10;
        }
        local_a8.Score = 0.0;
        local_a8.Word.Ptr = (wchar_t *)auStack_118;
        local_a8.Word.Len = (size_t)cand.Ptr;
        local_a8.Score = TLangModel::Score(&local_90->LangModel,(TWords *)auStack_88);
        if (((undefined1  [8])local_a8.Word.Ptr != auStack_68) ||
           ((wchar_t *)local_a8.Word.Len != w.Ptr)) {
          if (bVar15 && bVar14) {
            if (pTVar1 == pTVar2) {
              local_a8.Score = local_a8.Score * 50.0;
            }
            else {
              local_a8.Score = local_a8.Score - pTVar3->KnownWordsPenalty;
            }
          }
          else {
            local_a8.Score = local_a8.Score - pTVar3->UnknownWordsPenalty;
          }
        }
        std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::push_back
                  ((vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *)&w.Len
                   ,&local_a8);
        std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
                  ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)auStack_88);
      }
      sVar4 = w.Len;
      pTVar5 = scoredCandidates.
               super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pointer)w.Len !=
          scoredCandidates.
          super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        lVar13 = (long)scoredCandidates.
                       super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>
                       ._M_impl.super__Vector_impl_data._M_start - w.Len;
        uVar8 = lVar13 / 0x18;
        lVar10 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRaw(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
                  (w.Len,scoredCandidates.
                         super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>
                         ._M_impl.super__Vector_impl_data._M_start,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e)
        ;
        if (lVar13 < 0x181) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRaw(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
                    (sVar4,pTVar5);
        }
        else {
          pTVar12 = (pointer)(sVar4 + 0x180);
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRaw(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
                    (sVar4,pTVar12);
          for (; pTVar12 != pTVar5; pTVar12 = pTVar12 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,__gnu_cxx::__ops::_Val_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRaw(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
                      (pTVar12);
          }
        }
      }
      pTVar1 = (__return_storage_ptr__->
               super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((__return_storage_ptr__->
          super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
          super__Vector_impl_data._M_finish != pTVar1) {
        (__return_storage_ptr__->
        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
        super__Vector_impl_data._M_finish = pTVar1;
      }
      pTVar5 = scoredCandidates.
               super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (pTVar12 = (pointer)w.Len; pTVar12 != pTVar5; pTVar12 = pTVar12 + 1) {
        candSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)pTVar12->Score;
        auStack_88 = (undefined1  [8])(pTVar12->Word).Ptr;
        candSentence.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)(pTVar12->Word).Len;
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                  (__return_storage_ptr__,(value_type *)auStack_88);
      }
      std::_Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::
      ~_Vector_base((_Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *
                    )&w.Len);
      std::
      _Hashtable<NJamSpell::TWord,_NJamSpell::TWord,_std::allocator<NJamSpell::TWord>,_std::__detail::_Identity,_std::equal_to<NJamSpell::TWord>,_NJamSpell::TWordHashPtr,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<NJamSpell::TWord,_NJamSpell::TWord,_std::allocator<NJamSpell::TWord>,_std::__detail::_Identity,_std::equal_to<NJamSpell::TWord>,_NJamSpell::TWordHashPtr,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)local_100);
    }
  }
  else {
    (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

TWords TSpellCorrector::GetCandidatesRaw(const TWords& sentence, size_t position) const {
    if (position >= sentence.size()) {
        return TWords();
    }

    TWord w = sentence[position];

    TWords candidates = Edits2(w);

    bool firstLevel = true;
    bool knownWord = false;
    if (candidates.empty()) {
        candidates = Edits(w);
        firstLevel = false;
    }

    if (candidates.empty()) {
        return candidates;
    }

    {
        TWord c = LangModel.GetWord(std::wstring(w.Ptr, w.Len));
        if (c.Ptr && c.Len) {
            w = c;
            candidates.push_back(c);
            knownWord = true;
        } else {
            candidates.push_back(w);
        }
    }

    std::unordered_set<TWord, TWordHashPtr> uniqueCandidates(candidates.begin(), candidates.end());

    FilterCandidatesByFrequency(uniqueCandidates, w);

    std::vector<TScoredWord> scoredCandidates;
    scoredCandidates.reserve(uniqueCandidates.size());

    for (TWord cand: uniqueCandidates) {
        TWords candSentence;
        for (size_t i = 0; i < sentence.size(); ++i) {
            if (i == position) {
                candSentence.push_back(cand);
            } else if ((i < position && i + 2 >= position) ||
                       (i > position && i <= position + 2))
            {
                candSentence.push_back(sentence[i]);
            }
        }

        TScoredWord scored;
        scored.Word = cand;
        scored.Score = LangModel.Score(candSentence);
        if (!(scored.Word == w)) {
            if (knownWord) {
                if (firstLevel) {
                    scored.Score -= KnownWordsPenalty;
                } else {
                    scored.Score *= 50.0;
                }
            } else {
                scored.Score -= UnknownWordsPenalty;
            }
        }
        scoredCandidates.push_back(scored);
    }

    std::sort(scoredCandidates.begin(), scoredCandidates.end(), [](TScoredWord w1, TScoredWord w2) {
        return w1.Score > w2.Score;
    });

    candidates.clear();
    for (auto s: scoredCandidates) {
        candidates.push_back(s.Word);
    }
    return candidates;
}